

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

void af_latin_hints_link_segments
               (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  short sVar1;
  undefined2 uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  AF_Direction AVar6;
  AF_Segment pAVar7;
  undefined1 auVar8 [16];
  int iVar9;
  long lVar10;
  ulong uVar11;
  AF_Segment_conflict pAVar12;
  AF_Segment pAVar13;
  FT_Pos FVar14;
  ulong uVar15;
  AF_Segment_conflict pAVar16;
  short sVar17;
  AF_Segment_conflict pAVar18;
  FT_Pos pos1;
  
  iVar4 = hints->axis[dim].num_segments;
  if (width_count == 0) {
    FVar14 = 0;
  }
  else {
    FVar14 = widths[width_count - 1].org;
  }
  uVar5 = *(uint *)&hints->metrics[1].style_class;
  uVar15 = 1;
  if (0xff < (ulong)uVar5) {
    uVar15 = (ulong)(uVar5 >> 8);
  }
  if (0 < iVar4) {
    pAVar12 = hints->axis[dim].segments;
    pAVar13 = pAVar12 + iVar4;
    AVar6 = hints->axis[dim].major_dir;
    pAVar18 = pAVar12;
    do {
      if (AVar6 == pAVar18->dir) {
        sVar1 = pAVar18->pos;
        pAVar16 = pAVar12;
        do {
          if ((pAVar16->dir + AVar6 == 0) && (sVar1 < pAVar16->pos)) {
            uVar2 = pAVar18->max_coord;
            sVar17 = pAVar16->min_coord;
            if (pAVar16->min_coord < pAVar18->min_coord) {
              sVar17 = pAVar18->min_coord;
            }
            sVar3 = pAVar16->max_coord;
            if ((short)uVar2 < sVar3) {
              sVar3 = uVar2;
            }
            if ((long)uVar15 <= (long)sVar3 - (long)sVar17) {
              uVar11 = (long)pAVar16->pos - (long)sVar1;
              if (FVar14 != 0) {
                lVar10 = (long)(uVar11 * 0x400) / FVar14;
                uVar11 = 32000;
                if (lVar10 < 0x2b11) {
                  if (lVar10 < 0x401) {
                    uVar11 = 0;
                  }
                  else {
                    iVar9 = (int)lVar10 + -0x400;
                    uVar11 = (ulong)(uint)(iVar9 * iVar9) / 3000;
                  }
                }
              }
              auVar8._8_8_ = 0;
              auVar8._0_8_ = (ulong)uVar5 * 6000 >> 0xb;
              lVar10 = SUB168(auVar8 / SEXT816((long)sVar3 - (long)sVar17),0) + uVar11;
              if (lVar10 < pAVar18->score) {
                pAVar18->score = lVar10;
                pAVar18->link = pAVar16;
              }
              if (lVar10 < pAVar16->score) {
                pAVar16->score = lVar10;
                pAVar16->link = pAVar18;
              }
            }
          }
          pAVar16 = pAVar16 + 1;
        } while (pAVar16 < pAVar13);
      }
      pAVar18 = pAVar18 + 1;
    } while (pAVar18 < pAVar13);
    if (0 < iVar4) {
      do {
        pAVar7 = pAVar12->link;
        if ((pAVar7 != (AF_Segment)0x0) && (pAVar12 != pAVar7->link)) {
          pAVar12->link = (AF_Segment)0x0;
          pAVar12->serif = pAVar7->link;
        }
        pAVar12 = pAVar12 + 1;
      } while (pAVar12 < pAVar13);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_hints_link_segments( AF_GlyphHints  hints,
                                FT_UInt        width_count,
                                AF_WidthRec*   widths,
                                AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = segments + axis->num_segments;
    FT_Pos        len_threshold, len_score, dist_score, max_width;
    AF_Segment    seg1, seg2;


    if ( width_count )
      max_width = widths[width_count - 1].org;
    else
      max_width = 0;

    /* a heuristic value to set up a minimum value for overlapping */
    len_threshold = AF_LATIN_CONSTANT( hints->metrics, 8 );
    if ( len_threshold == 0 )
      len_threshold = 1;

    /* a heuristic value to weight lengths */
    len_score = AF_LATIN_CONSTANT( hints->metrics, 6000 );

    /* a heuristic value to weight distances (no call to    */
    /* AF_LATIN_CONSTANT needed, since we work on multiples */
    /* of the stem width)                                   */
    dist_score = 3000;

    /* now compare each segment to the others */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      if ( seg1->dir != axis->major_dir )
        continue;

      /* search for stems having opposite directions, */
      /* with seg1 to the `left' of seg2              */
      for ( seg2 = segments; seg2 < segment_limit; seg2++ )
      {
        FT_Pos  pos1 = seg1->pos;
        FT_Pos  pos2 = seg2->pos;


        if ( seg1->dir + seg2->dir == 0 && pos2 > pos1 )
        {
          /* compute distance between the two segments */
          FT_Pos  min = seg1->min_coord;
          FT_Pos  max = seg1->max_coord;
          FT_Pos  len;


          if ( min < seg2->min_coord )
            min = seg2->min_coord;

          if ( max > seg2->max_coord )
            max = seg2->max_coord;

          /* compute maximum coordinate difference of the two segments */
          /* (this is, how much they overlap)                          */
          len = max - min;
          if ( len >= len_threshold )
          {
            /*
             *  The score is the sum of two demerits indicating the
             *  `badness' of a fit, measured along the segments' main axis
             *  and orthogonal to it, respectively.
             *
             *  o The less overlapping along the main axis, the worse it
             *    is, causing a larger demerit.
             *
             *  o The nearer the orthogonal distance to a stem width, the
             *    better it is, causing a smaller demerit.  For simplicity,
             *    however, we only increase the demerit for values that
             *    exceed the largest stem width.
             */

            FT_Pos  dist = pos2 - pos1;

            FT_Pos  dist_demerit, score;


            if ( max_width )
            {
              /* distance demerits are based on multiples of `max_width'; */
              /* we scale by 1024 for getting more precision              */
              FT_Pos  delta = ( dist << 10 ) / max_width - ( 1 << 10 );


              if ( delta > 10000 )
                dist_demerit = 32000;
              else if ( delta > 0 )
                dist_demerit = delta * delta / dist_score;
              else
                dist_demerit = 0;
            }
            else
              dist_demerit = dist; /* default if no widths available */

            score = dist_demerit + len_score / len;

            /* and we search for the smallest score */
            if ( score < seg1->score )
            {
              seg1->score = score;
              seg1->link  = seg2;
            }

            if ( score < seg2->score )
            {
              seg2->score = score;
              seg2->link  = seg1;
            }
          }
        }
      }
    }

    /* now compute the `serif' segments, cf. explanations in `afhints.h' */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      seg2 = seg1->link;

      if ( seg2 )
      {
        if ( seg2->link != seg1 )
        {
          seg1->link  = 0;
          seg1->serif = seg2->link;
        }
      }
    }
  }